

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STTx.cpp
# Opt level: O0

int __thiscall jbcoin::STTx::sign(STTx *this,PublicKey *publicKey,SecretKey *secretKey)

{
  uint32_t prefix;
  int extraout_EAX;
  uint256 local_98;
  Slice local_78 [2];
  enable_if_t<std::is_same<unsigned_char,_char>::value____std::is_same<unsigned_char,_unsigned_char>::value,_Slice>
  local_58;
  undefined1 local_48 [8];
  Buffer sig;
  Blob data;
  SecretKey *secretKey_local;
  PublicKey *publicKey_local;
  STTx *this_local;
  
  getSigningData((Blob *)&sig.size_,this);
  local_58 = makeSlice<unsigned_char,std::allocator<unsigned_char>>
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sig.size_);
  jbcoin::sign((jbcoin *)local_48,publicKey,secretKey,&local_58);
  local_78[0] = Buffer::operator_cast_to_Slice((Buffer *)local_48);
  STObject::setFieldVL(&this->super_STObject,(SField *)sfTxnSignature,local_78);
  prefix = HashPrefix::operator_cast_to_unsigned_int((HashPrefix *)&HashPrefix::transactionID);
  STObject::getHash(&local_98,&this->super_STObject,prefix);
  base_uint<256UL,_void>::operator=(&this->tid_,&local_98);
  Buffer::~Buffer((Buffer *)local_48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sig.size_);
  return extraout_EAX;
}

Assistant:

void STTx::sign (
    PublicKey const& publicKey,
    SecretKey const& secretKey)
{
    auto const data = getSigningData (*this);

    auto const sig = jbcoin::sign (
        publicKey,
        secretKey,
        makeSlice(data));

    setFieldVL (sfTxnSignature, sig);
    tid_ = getHash(HashPrefix::transactionID);
}